

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void * TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
       ThreadWork(void *voidptr)

{
  undefined1 uVar1;
  TPZFMatrix<std::complex<double>_> *assembleItem;
  void *in_RDI;
  TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> data;
  TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *myptr
  ;
  TPZFMatrix<std::complex<double>_> *in_stack_000004b0;
  TPZFMatrix<std::complex<double>_> *in_stack_000004b8;
  TPZDohrSubstruct<std::complex<double>_> *in_stack_000004c0;
  TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
  *in_stack_ffffffffffffff78;
  TPZDohrAssembleList<std::complex<double>_> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffffa0;
  TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
  *in_stack_ffffffffffffffb8;
  TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_> local_28;
  TPZAutoPointer local_20 [8];
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> local_18;
  void *local_10;
  void *local_8;
  
  local_10 = in_RDI;
  local_8 = in_RDI;
  PopItem(in_stack_ffffffffffffffb8);
  while( true ) {
    uVar1 = TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
            ::IsValid((TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
                       *)0x1f87a65);
    if (!(bool)uVar1) break;
    TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>::operator->(&local_28);
    assembleItem = ::TPZAutoPointer::operator_cast_to_TPZFMatrix_(local_20);
    TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::operator->(&local_18);
    TPZDohrSubstruct<std::complex<double>_>::Contribute_v2_local
              (in_stack_000004c0,in_stack_000004b8,in_stack_000004b0);
    in_stack_ffffffffffffff80 =
         TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_> *)
                    ((long)local_10 + 0x40));
    TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> *)
               in_stack_ffffffffffffff80,
               (TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> *)
               in_stack_ffffffffffffff78);
    TPZDohrAssembleList<std::complex<double>_>::AddItem
              ((TPZDohrAssembleList<std::complex<double>_> *)
               CONCAT17(uVar1,in_stack_ffffffffffffffa0),
               (TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> *)assembleItem);
    TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> *)
               in_stack_ffffffffffffff80);
    PopItem(in_stack_ffffffffffffffb8);
    TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
    operator=((TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
               *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
    ~TPZDohrPrecondV2SubData
              ((TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
                *)in_stack_ffffffffffffff80);
  }
  TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
  ~TPZDohrPrecondV2SubData
            ((TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
              *)in_stack_ffffffffffffff80);
  return local_8;
}

Assistant:

void *TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork(void *voidptr)
{
	TPZDohrPrecondV2SubDataList<TVar,TSubStruct>	*myptr = (TPZDohrPrecondV2SubDataList<TVar,TSubStruct> *) voidptr;
	TPZDohrPrecondV2SubData<TVar,TSubStruct> data = myptr->PopItem();
	while (data.IsValid()) {
		data.fSubStructure->Contribute_v2_local(data.fInput_local,data.fv2_local->fAssembleData);
		myptr->fAssemblyStructure->AddItem(data.fv2_local);
		data = myptr->PopItem();
	}
	return voidptr;
}